

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O0

FxExpression * ParseExpressionG(FScanner *sc,PClassActor *cls)

{
  int o;
  bool bVar1;
  FxExpression *r;
  FxExpression *this;
  bool bVar2;
  FxExpression *right;
  FxExpression *pFStack_20;
  int token;
  FxExpression *tmp;
  PClassActor *cls_local;
  FScanner *sc_local;
  
  pFStack_20 = ParseExpressionF(sc,cls);
  while( true ) {
    bVar1 = FScanner::GetToken(sc);
    bVar2 = false;
    if ((bVar1) && (bVar2 = true, sc->TokenType != 0x11f)) {
      bVar2 = sc->TokenType == 0x120;
    }
    if (!bVar2) break;
    o = sc->TokenType;
    r = ParseExpressionF(sc,cls);
    this = (FxExpression *)operator_new(0x48);
    FxCompareEq::FxCompareEq((FxCompareEq *)this,o,pFStack_20,r);
    pFStack_20 = this;
  }
  if ((sc->End & 1U) == 0) {
    FScanner::UnGet(sc);
  }
  return pFStack_20;
}

Assistant:

static FxExpression *ParseExpressionG (FScanner &sc, PClassActor *cls)
{
	FxExpression *tmp = ParseExpressionF (sc, cls);

	while (sc.GetToken() && (sc.TokenType == TK_Eq || sc.TokenType == TK_Neq))
	{
		int token = sc.TokenType;
		FxExpression *right = ParseExpressionF (sc, cls);
		tmp = new FxCompareEq(token, tmp, right);
	}
	if (!sc.End) sc.UnGet();
	return tmp;
}